

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.c
# Opt level: O3

void nn_xsub_rm(nn_sockbase *self,nn_pipe *pipe)

{
  nn_fq_data *data;
  
  data = (nn_fq_data *)nn_pipe_getdata(pipe);
  nn_fq_rm((nn_fq *)(self + 1),data);
  nn_free(data);
  return;
}

Assistant:

static void nn_xsub_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xsub *xsub;
    struct nn_xsub_data *data;

    xsub = nn_cont (self, struct nn_xsub, sockbase);
    data = nn_pipe_getdata (pipe);
    nn_fq_rm (&xsub->fq, &data->fq);
    nn_free (data);
}